

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O0

AST * parse_finish_while_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  Queue *pQVar2;
  AST *pAVar3;
  AST_While_Statement *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  translation_data_local = (Translation_Data *)get_while_statement_tree();
  cVar1 = get_and_check(translation_data,KW_OPEN_NORMAL);
  if (cVar1 == '\0') {
    push_translation_error(" \'(\' expected",translation_data);
    translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
  }
  else {
    pQVar2 = (Queue *)parse_expression(translation_data,scope);
    translation_data_local->errors = pQVar2;
    cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
    if (cVar1 == '\0') {
      push_translation_error(" \')\' expected",translation_data);
      translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
    }
    else {
      pAVar3 = parse_statement(translation_data,scope);
      translation_data_local->number_of_errors_when_last_checked = (size_t)pAVar3;
    }
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_finish_while_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST_While_Statement *hold;
	hold=get_while_statement_tree();
	if(get_and_check(translation_data,KW_OPEN_NORMAL))
	{
		hold->condition=parse_expression(translation_data,scope);
		if(get_and_check(translation_data,KW_CLOSE_NORMAL))
		{
			hold->body_statement=parse_statement(translation_data,scope);
		}else
		{
			push_translation_error(" ')' expected",translation_data);
			return (struct AST*)get_error_tree((struct AST*)hold);
		}
	}else
	{
		push_translation_error(" '(' expected",translation_data);
		return (struct AST*)get_error_tree((struct AST*)hold);
	}

	return (struct AST*)hold;
}